

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sampleIsBetter(Stat4Accum *pAccum,Stat4Sample *pNew,Stat4Sample *pOld)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = pNew->iCol;
  iVar2 = pOld->iCol;
  iVar3 = 1;
  if (pNew->anEq[iVar1] <= pOld->anEq[iVar2]) {
    if (pNew->anEq[iVar1] != pOld->anEq[iVar2]) {
      return 0;
    }
    if ((iVar2 <= iVar1) && (iVar3 = 0, iVar1 == iVar2)) {
      lVar4 = (long)pNew->iCol;
      while( true ) {
        lVar4 = lVar4 + 1;
        if (pAccum->nCol <= lVar4) {
          return (uint)(pOld->iHash < pNew->iHash);
        }
        if (pOld->anEq[lVar4] < pNew->anEq[lVar4]) break;
        if (pNew->anEq[lVar4] < pOld->anEq[lVar4]) {
          return 0;
        }
      }
      return 1;
    }
  }
  return iVar3;
}

Assistant:

static int sampleIsBetter(
  Stat4Accum *pAccum, 
  Stat4Sample *pNew, 
  Stat4Sample *pOld
){
  tRowcnt nEqNew = pNew->anEq[pNew->iCol];
  tRowcnt nEqOld = pOld->anEq[pOld->iCol];

  assert( pOld->isPSample==0 && pNew->isPSample==0 );
  assert( IsStat4 || (pNew->iCol==0 && pOld->iCol==0) );

  if( (nEqNew>nEqOld) ) return 1;
#ifdef SQLITE_ENABLE_STAT4
  if( nEqNew==nEqOld ){
    if( pNew->iCol<pOld->iCol ) return 1;
    return (pNew->iCol==pOld->iCol && sampleIsBetterPost(pAccum, pNew, pOld));
  }
  return 0;
#else
  return (nEqNew==nEqOld && pNew->iHash>pOld->iHash);
#endif
}